

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

void stbir__calculate_sample_range_downsample
               (int n,float in_pixels_radius,float scale_ratio,float out_shift,int *out_first_pixel,
               int *out_last_pixel,float *out_center_of_in)

{
  double dVar1;
  float fVar2;
  
  fVar2 = (float)n + 0.5;
  *out_center_of_in = fVar2 * scale_ratio - out_shift;
  dVar1 = floor((double)((fVar2 - in_pixels_radius) * scale_ratio - out_shift) + 0.5);
  *out_first_pixel = (int)dVar1;
  dVar1 = floor((double)((in_pixels_radius + fVar2) * scale_ratio - out_shift) + -0.5);
  *out_last_pixel = (int)dVar1;
  return;
}

Assistant:

static void stbir__calculate_sample_range_downsample(int n, float in_pixels_radius, float scale_ratio, float out_shift, int* out_first_pixel, int* out_last_pixel, float* out_center_of_in)
{
    float in_pixel_center = (float)n + 0.5f;
    float in_pixel_influence_lowerbound = in_pixel_center - in_pixels_radius;
    float in_pixel_influence_upperbound = in_pixel_center + in_pixels_radius;

    float out_pixel_influence_lowerbound = in_pixel_influence_lowerbound * scale_ratio - out_shift;
    float out_pixel_influence_upperbound = in_pixel_influence_upperbound * scale_ratio - out_shift;

    *out_center_of_in = in_pixel_center * scale_ratio - out_shift;
    *out_first_pixel = (int)(floor(out_pixel_influence_lowerbound + 0.5));
    *out_last_pixel = (int)(floor(out_pixel_influence_upperbound - 0.5));
}